

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O3

void __thiscall BronKerbosch::printSet(BronKerbosch *this,ostream *os,alignment_set_t *set)

{
  size_type pos;
  
  for (pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                       (set,0); pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(set,pos)
      ) {
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void BronKerbosch::printSet(std::ostream& os, alignment_set_t set) {
    for (auto j = set.find_first(); j != alignment_set_t::npos; j = set.find_next(j)) {
        os << " " << j;
    }
    os << endl;
}